

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono.h
# Opt level: O2

iterator __thiscall
fmt::v5::formatter<std::chrono::duration<int,_std::ratio<1L,_100L>_>,_char,_void>::parse
          (formatter<std::chrono::duration<int,_std::ratio<1L,_100L>_>,_char,_void> *this,
          basic_parse_context<char,_fmt::v5::internal::error_handler> *ctx)

{
  size_t sVar1;
  char *begin;
  char *begin_00;
  char *end;
  spec_handler handler;
  chrono_format_checker local_29;
  spec_handler local_28;
  
  begin = (ctx->format_str_).data_;
  sVar1 = (ctx->format_str_).size_;
  if (sVar1 != 0) {
    end = begin + sVar1;
    local_28.f = this;
    local_28.context = ctx;
    begin = internal::
            parse_align<char,fmt::v5::formatter<std::chrono::duration<int,std::ratio<1l,100l>>,char,void>::spec_handler&>
                      (begin,end,&local_28);
    if (begin != end) {
      begin_00 = internal::
                 parse_width<char,fmt::v5::formatter<std::chrono::duration<int,std::ratio<1l,100l>>,char,void>::spec_handler&>
                           (begin,end,&local_28);
      begin = internal::parse_chrono_format<char,fmt::v5::internal::chrono_format_checker>
                        (begin_00,end,&local_29);
      (this->format_str).data_ = begin_00;
      (this->format_str).size_ = (long)begin - (long)begin_00;
    }
  }
  return begin;
}

Assistant:

make_arg_ref(internal::auto_id) {
      return arg_ref_type(context.next_arg_id());
    }